

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmTarget.cxx
# Opt level: O3

void __thiscall cmTarget::ComputeLinkClosure(cmTarget *this,string *config,LinkClosure *lc)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  char *pcVar2;
  LinkClosure *pLVar3;
  bool bVar4;
  LinkImplementation *pLVar5;
  char *pcVar6;
  long *plVar7;
  long lVar8;
  size_type *psVar9;
  long lVar10;
  pointer item;
  pointer pbVar11;
  string propagates;
  const_iterator li;
  hash_set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmsys::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<char>_>
  languages;
  const_iterator sit;
  cmTargetCollectLinkLanguages cll;
  string local_168;
  LinkClosure *local_148;
  undefined1 local_140 [16];
  undefined1 local_130 [56];
  undefined1 local_f8 [16];
  pointer local_e8;
  size_type local_d8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_d0;
  _Hashtable_const_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmsys::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_cmsys::_Identity<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<char>_>
  local_b0;
  undefined1 local_a0 [64];
  _Rb_tree<const_cmTarget_*,_const_cmTarget_*,_std::_Identity<const_cmTarget_*>,_std::less<const_cmTarget_*>,_std::allocator<const_cmTarget_*>_>
  local_60;
  
  local_148 = lc;
  cmsys::
  hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmsys::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_cmsys::_Identity<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<char>_>
  ::hashtable((hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmsys::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_cmsys::_Identity<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<char>_>
               *)local_f8,100,
              (hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
               *)local_a0,
              (equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
               *)local_140,(allocator_type *)&local_168);
  pLVar5 = GetLinkImplementation(this,config);
  pbVar11 = (pLVar5->Languages).
            super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ._M_impl.super__Vector_impl_data._M_start;
  if (pbVar11 !=
      (pLVar5->Languages).
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_finish) {
    do {
      cmsys::
      hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmsys::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_cmsys::_Identity<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<char>_>
      ::resize((hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmsys::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_cmsys::_Identity<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<char>_>
                *)local_f8,local_d8 + 1);
      cmsys::
      hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmsys::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_cmsys::_Identity<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<char>_>
      ::insert_unique_noresize
                ((pair<cmsys::_Hashtable_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmsys::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_cmsys::_Identity<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<char>_>,_bool>
                  *)local_a0,
                 (hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmsys::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_cmsys::_Identity<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<char>_>
                  *)local_f8,pbVar11);
      pbVar11 = pbVar11 + 1;
    } while (pbVar11 !=
             (pLVar5->Languages).
             super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             ._M_impl.super__Vector_impl_data._M_finish);
  }
  cmTargetCollectLinkLanguages::cmTargetCollectLinkLanguages
            ((cmTargetCollectLinkLanguages *)local_a0,this,config,
             (hash_set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmsys::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<char>_>
              *)local_f8,this);
  pLVar3 = local_148;
  item = (pLVar5->super_LinkImplementationLibraries).Libraries.
         super__Vector_base<cmLinkImplItem,_std::allocator<cmLinkImplItem>_>._M_impl.
         super__Vector_impl_data._M_start;
  if (item != (pLVar5->super_LinkImplementationLibraries).Libraries.
              super__Vector_base<cmLinkImplItem,_std::allocator<cmLinkImplItem>_>._M_impl.
              super__Vector_impl_data._M_finish) {
    do {
      cmTargetCollectLinkLanguages::Visit
                ((cmTargetCollectLinkLanguages *)local_a0,&item->super_cmLinkItem);
      item = item + 1;
    } while (item != (pLVar5->super_LinkImplementationLibraries).Libraries.
                     super__Vector_base<cmLinkImplItem,_std::allocator<cmLinkImplItem>_>._M_impl.
                     super__Vector_impl_data._M_finish);
  }
  if ((long)local_e8 - local_f8._8_8_ != 0) {
    lVar8 = (long)local_e8 - local_f8._8_8_ >> 3;
    lVar10 = 0;
LAB_002a42c6:
    local_140._0_8_ = *(pointer)(local_f8._8_8_ + lVar10 * 8);
    if ((_Hashtable_node<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
         *)local_140._0_8_ ==
        (_Hashtable_node<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
         *)0x0) goto code_r0x002a42cf;
    local_140._8_8_ = (cmTarget *)local_f8;
    do {
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::push_back(&pLVar3->Languages,(value_type *)(local_140._0_8_ + 8));
      cmsys::
      _Hashtable_const_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmsys::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_cmsys::_Identity<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<char>_>
      ::operator++((_Hashtable_const_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmsys::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_cmsys::_Identity<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<char>_>
                    *)local_140);
    } while ((_Hashtable_node<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
              *)local_140._0_8_ !=
             (_Hashtable_node<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
              *)0x0);
  }
LAB_002a4307:
  local_130._0_4_ = 0x5f534148;
  local_140._8_8_ = (cmTarget *)0x7;
  local_130._4_4_ = 0x585843;
  local_140._0_8_ = (_Node *)local_130;
  pcVar6 = GetProperty(this,(string *)local_140,this->Makefile);
  if ((_Node *)local_140._0_8_ != (_Node *)local_130) {
    operator_delete((void *)local_140._0_8_,CONCAT44(local_130._4_4_,local_130._0_4_) + 1);
  }
  if (pcVar6 == (char *)0x0) {
    local_130._0_4_ = 0x4b4e494c;
    local_130._4_4_ = 0x4c5f5245;
    local_130._8_7_ = 0x45474155474e41;
    local_140._8_8_ = (cmTarget *)0xf;
    local_130[0xf] = '\0';
    local_140._0_8_ = (_Node *)local_130;
    pcVar6 = GetProperty(this,(string *)local_140,this->Makefile);
    if ((_Node *)local_140._0_8_ != (_Node *)local_130) {
      operator_delete((void *)local_140._0_8_,CONCAT44(local_130._4_4_,local_130._0_4_) + 1);
    }
    if (pcVar6 == (char *)0x0) {
      cmTargetSelectLinker::cmTargetSelectLinker((cmTargetSelectLinker *)local_140,this);
      pbVar11 = (pLVar5->Languages).
                super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                ._M_impl.super__Vector_impl_data._M_start;
      if (pbVar11 !=
          (pLVar5->Languages).
          super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ._M_impl.super__Vector_impl_data._M_finish) {
        do {
          cmTargetSelectLinker::Consider((cmTargetSelectLinker *)local_140,pbVar11);
          pbVar11 = pbVar11 + 1;
        } while (pbVar11 !=
                 (pLVar5->Languages).
                 super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 ._M_impl.super__Vector_impl_data._M_finish);
      }
      if ((long)local_e8 - local_f8._8_8_ != 0) {
        lVar8 = (long)local_e8 - local_f8._8_8_ >> 3;
        lVar10 = 0;
        do {
          local_b0._M_cur = *(pointer)(local_f8._8_8_ + lVar10 * 8);
          if (local_b0._M_cur !=
              (_Hashtable_node<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
               *)0x0) goto LAB_002a4466;
          lVar10 = lVar10 + 1;
        } while (lVar8 + (ulong)(lVar8 == 0) != lVar10);
      }
      local_b0._M_cur =
           (_Hashtable_node<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
            *)0x0;
LAB_002a4466:
      paVar1 = &local_168.field_2;
      local_b0._M_ht = (_Hashtable *)local_f8;
      while (local_b0._M_cur !=
             (_Hashtable_node<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
              *)0x0) {
        std::operator+(&local_d0,"CMAKE_",&(local_b0._M_cur)->_M_val);
        plVar7 = (long *)std::__cxx11::string::append((char *)&local_d0);
        psVar9 = (size_type *)(plVar7 + 2);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)*plVar7 ==
            (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)psVar9) {
          local_168.field_2._M_allocated_capacity = *psVar9;
          local_168.field_2._8_8_ = plVar7[3];
          local_168._M_dataplus._M_p = (pointer)paVar1;
        }
        else {
          local_168.field_2._M_allocated_capacity = *psVar9;
          local_168._M_dataplus._M_p = (pointer)*plVar7;
        }
        local_168._M_string_length = plVar7[1];
        *plVar7 = (long)psVar9;
        plVar7[1] = 0;
        *(undefined1 *)(plVar7 + 2) = 0;
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_d0._M_dataplus._M_p != &local_d0.field_2) {
          operator_delete(local_d0._M_dataplus._M_p,local_d0.field_2._M_allocated_capacity + 1);
        }
        bVar4 = cmMakefile::IsOn(this->Makefile,&local_168);
        if (bVar4) {
          cmTargetSelectLinker::Consider
                    ((cmTargetSelectLinker *)local_140,&(local_b0._M_cur)->_M_val);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_168._M_dataplus._M_p != paVar1) {
          operator_delete(local_168._M_dataplus._M_p,local_168.field_2._M_allocated_capacity + 1);
        }
        cmsys::
        _Hashtable_const_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmsys::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_cmsys::_Identity<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<char>_>
        ::operator++(&local_b0);
      }
      cmTargetSelectLinker::Choose_abi_cxx11_(&local_168,(cmTargetSelectLinker *)local_140);
      std::__cxx11::string::operator=((string *)local_148,(string *)&local_168);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_168._M_dataplus._M_p != paVar1) {
        operator_delete(local_168._M_dataplus._M_p,local_168.field_2._M_allocated_capacity + 1);
      }
      cmsys::
      hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmsys::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_cmsys::_Identity<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<char>_>
      ::~hashtable((hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmsys::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_cmsys::_Identity<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<char>_>
                    *)(local_130 + 0x10));
    }
    else {
      pcVar2 = (char *)(pLVar3->LinkerLanguage)._M_string_length;
      strlen(pcVar6);
      std::__cxx11::string::_M_replace((ulong)pLVar3,0,pcVar2,(ulong)pcVar6);
    }
  }
  else {
    std::__cxx11::string::_M_replace
              ((ulong)pLVar3,0,(char *)(pLVar3->LinkerLanguage)._M_string_length,0x4a9266);
  }
  std::
  _Rb_tree<const_cmTarget_*,_const_cmTarget_*,_std::_Identity<const_cmTarget_*>,_std::less<const_cmTarget_*>,_std::allocator<const_cmTarget_*>_>
  ::~_Rb_tree(&local_60);
  if ((_Node *)local_a0._0_8_ != (_Node *)(local_a0 + 0x10)) {
    operator_delete((void *)local_a0._0_8_,local_a0._16_8_ + 1);
  }
  cmsys::
  hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmsys::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_cmsys::_Identity<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<char>_>
  ::~hashtable((hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmsys::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_cmsys::_Identity<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<char>_>
                *)local_f8);
  return;
code_r0x002a42cf:
  lVar10 = lVar10 + 1;
  if (lVar8 + (ulong)(lVar8 == 0) == lVar10) goto LAB_002a4307;
  goto LAB_002a42c6;
}

Assistant:

void cmTarget::ComputeLinkClosure(const std::string& config,
                                  LinkClosure& lc) const
{
  // Get languages built in this target.
  UNORDERED_SET<std::string> languages;
  LinkImplementation const* impl = this->GetLinkImplementation(config);
  for(std::vector<std::string>::const_iterator li = impl->Languages.begin();
      li != impl->Languages.end(); ++li)
    {
    languages.insert(*li);
    }

  // Add interface languages from linked targets.
  cmTargetCollectLinkLanguages cll(this, config, languages, this);
  for(std::vector<cmLinkImplItem>::const_iterator
        li = impl->Libraries.begin();
      li != impl->Libraries.end(); ++li)
    {
    cll.Visit(*li);
    }

  // Store the transitive closure of languages.
  for(UNORDERED_SET<std::string>::const_iterator li = languages.begin();
      li != languages.end(); ++li)
    {
    lc.Languages.push_back(*li);
    }

  // Choose the language whose linker should be used.
  if(this->GetProperty("HAS_CXX"))
    {
    lc.LinkerLanguage = "CXX";
    }
  else if(const char* linkerLang = this->GetProperty("LINKER_LANGUAGE"))
    {
    lc.LinkerLanguage = linkerLang;
    }
  else
    {
    // Find the language with the highest preference value.
    cmTargetSelectLinker tsl(this);

    // First select from the languages compiled directly in this target.
    for(std::vector<std::string>::const_iterator li = impl->Languages.begin();
        li != impl->Languages.end(); ++li)
      {
      tsl.Consider(*li);
      }

    // Now consider languages that propagate from linked targets.
    for(UNORDERED_SET<std::string>::const_iterator sit = languages.begin();
        sit != languages.end(); ++sit)
      {
      std::string propagates = "CMAKE_"+*sit+"_LINKER_PREFERENCE_PROPAGATES";
      if(this->Makefile->IsOn(propagates))
        {
        tsl.Consider(*sit);
        }
      }

    lc.LinkerLanguage = tsl.Choose();
    }
}